

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

void __thiscall backend::codegen::RegAllocator::calc_live_intervals(RegAllocator *this)

{
  _Head_base<0UL,_arm::Inst_*,_false> _Var1;
  undefined **ppuVar2;
  pointer puVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  uint point;
  ulong uVar7;
  iterator __begin11;
  OpCode OVar8;
  iterator __begin12;
  Inst *pIVar9;
  iterator __end12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id_str;
  __hashtable *__h;
  uint local_168 [18];
  pair<const_int,_unsigned_int> local_120 [6];
  string local_f0 [2];
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_98;
  _Rb_tree<int,std::pair<int_const,unsigned_int>,std::_Select1st<std::pair<int_const,unsigned_int>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_int>>>
  *local_90;
  undefined **local_88;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_80;
  undefined **local_78;
  undefined **local_70;
  undefined **local_68;
  undefined **local_60;
  undefined **local_58;
  undefined **local_50;
  
  local_168[0] = 0;
  puVar3 = (this->f->inst).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->f->inst).
      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    local_90 = (_Rb_tree<int,std::pair<int_const,unsigned_int>,std::_Select1st<std::pair<int_const,unsigned_int>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_int>>>
                *)&this->point_bb_map;
    local_50 = &PTR_display_001ed8f0;
    local_58 = &PTR_display_001ed930;
    local_60 = &PTR_display_001ed970;
    local_68 = &PTR_display_001ed9b0;
    local_70 = &PTR_display_001ed9f0;
    local_78 = &PTR_display_001eda30;
    local_88 = &PTR_display_001ed738;
    local_80 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->bl_points;
    local_98 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->reg_affine;
    uVar6 = 0;
    uVar7 = 0;
    do {
      _Var1._M_head_impl =
           puVar3[uVar6]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t
           .super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      ppuVar2 = ((_Var1._M_head_impl)->super_Displayable)._vptr_Displayable;
      if (ppuVar2 != &PTR_display_001ed870) {
        point = (uint)uVar7;
        if (ppuVar2 == &PTR_display_001ed8b0) {
          add_reg_read(this,*(Reg *)((long)(_Var1._M_head_impl + 1) + 4),point);
          add_reg_read(this,*(OpCode *)((long)(_Var1._M_head_impl + 1) + 8),local_168[0]);
          OVar8 = *(OpCode *)((long)(_Var1._M_head_impl + 1) + 0xc);
LAB_00172ad9:
          add_reg_read(this,OVar8,local_168[0]);
        }
        else {
          if (ppuVar2 != local_50) {
            if (ppuVar2 == local_58) {
              if ((_Var1._M_head_impl)->op - Mov < 3) {
                add_reg_write(this,*(Reg *)&_Var1._M_head_impl[1].super_Displayable,point);
                if ((((*(char *)&_Var1._M_head_impl[3].super_Displayable == '\0') &&
                     ((_Var1._M_head_impl)->op == Mov)) &&
                    (*(char *)((long)(_Var1._M_head_impl + 2) + 0xd) == '\0')) &&
                   ((*(uint *)&_Var1._M_head_impl[1].super_Displayable < 0x40 &&
                    (*(OpCode *)((long)(_Var1._M_head_impl + 2) + 8) < 0x40)))) {
                  local_f0[0]._M_dataplus._M_p._0_4_ =
                       *(uint *)&_Var1._M_head_impl[1].super_Displayable;
                  local_f0[0]._M_dataplus._M_p._4_4_ =
                       *(OpCode *)((long)(_Var1._M_head_impl + 2) + 8);
                  std::
                  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>(local_98,local_f0);
                }
              }
              else {
                add_reg_read(this,*(Reg *)&_Var1._M_head_impl[1].super_Displayable,point);
              }
              if (*(char *)&_Var1._M_head_impl[3].super_Displayable == '\0') {
                OVar8 = *(OpCode *)((long)(_Var1._M_head_impl + 2) + 8);
LAB_00172cbf:
                add_reg_read(this,OVar8,local_168[0]);
              }
            }
            else if (ppuVar2 == local_60) {
              if ((_Var1._M_head_impl)->op == Bl) {
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>(local_80,(int *)local_168);
              }
            }
            else if (ppuVar2 == local_68) {
              if ((_Var1._M_head_impl)->op == LdR) {
                add_reg_write(this,*(Reg *)&_Var1._M_head_impl[1].super_Displayable,point);
              }
              else {
                add_reg_read(this,*(Reg *)&_Var1._M_head_impl[1].super_Displayable,point);
              }
              if (*(undefined1 *)((long)(_Var1._M_head_impl + 4) + 8) == B) {
                add_reg_read(this,(MemoryOperand *)((long)(_Var1._M_head_impl + 1) + 8),local_168[0]
                            );
              }
            }
            else {
              if (ppuVar2 == local_70) {
                p_Var5 = *(_Rb_tree_node_base **)((long)(_Var1._M_head_impl + 2) + 8);
                if ((_Var1._M_head_impl)->op == LdM) {
                  for (; p_Var5 != (_Rb_tree_node_base *)((long)(_Var1._M_head_impl + 1) + 8U);
                      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
                    add_reg_write(this,p_Var5[1]._M_color,local_168[0]);
                  }
                }
                else {
                  for (; p_Var5 != (_Rb_tree_node_base *)((long)(_Var1._M_head_impl + 1) + 8U);
                      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
                    add_reg_read(this,p_Var5[1]._M_color,local_168[0]);
                  }
                }
                OVar8 = *(OpCode *)&_Var1._M_head_impl[4].super_Displayable;
                goto LAB_00172cbf;
              }
              if (ppuVar2 == local_78) {
                p_Var5 = *(_Rb_tree_node_base **)((long)(_Var1._M_head_impl + 2) + 8);
                if ((_Var1._M_head_impl)->op == Push) {
                  for (; p_Var5 != (_Rb_tree_node_base *)((long)(_Var1._M_head_impl + 1) + 8U);
                      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
                    add_reg_write(this,p_Var5[1]._M_color,local_168[0]);
                  }
                }
                else {
                  for (; p_Var5 != (_Rb_tree_node_base *)((long)(_Var1._M_head_impl + 1) + 8U);
                      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
                    add_reg_read(this,p_Var5[1]._M_color,local_168[0]);
                  }
                }
              }
              else if (ppuVar2 == local_88) {
                pIVar9 = _Var1._M_head_impl + 1;
                lVar4 = std::__cxx11::string::find((char *)pIVar9,0x1b8629,0);
                if (lVar4 == 0) {
                  std::__cxx11::string::find_last_of((char *)pIVar9,0x1b8f84,0xffffffffffffffff);
                  std::__cxx11::string::substr((ulong)local_f0,(ulong)pIVar9);
                  local_120[0].second = std::__cxx11::stoi(local_f0,(size_t *)0x0,10);
                  local_120[0].first = local_168[0];
                  std::
                  _Rb_tree<int,std::pair<int_const,unsigned_int>,std::_Select1st<std::pair<int_const,unsigned_int>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_int>>>
                  ::_M_insert_unique<std::pair<int_const,unsigned_int>>(local_90,local_120);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_f0[0]._M_dataplus._M_p._4_4_,
                                  (uint)local_f0[0]._M_dataplus._M_p) != &local_f0[0].field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_f0[0]._M_dataplus._M_p._4_4_,
                                             (uint)local_f0[0]._M_dataplus._M_p),
                                    local_f0[0].field_2._M_allocated_capacity + 1);
                  }
                }
              }
            }
            goto LAB_00172b09;
          }
          add_reg_read(this,*(Reg *)((long)(_Var1._M_head_impl + 1) + 4),point);
          if (*(char *)&_Var1._M_head_impl[3].super_Displayable == '\0') {
            OVar8 = *(OpCode *)((long)(_Var1._M_head_impl + 2) + 8);
            goto LAB_00172ad9;
          }
        }
        add_reg_write(this,*(Reg *)&_Var1._M_head_impl[1].super_Displayable,local_168[0]);
      }
LAB_00172b09:
      uVar6 = (long)(int)local_168[0] + 1;
      local_168[0] = (uint)uVar6;
      puVar3 = (this->f->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar6 & 0xffffffff;
    } while (uVar6 < (ulong)((long)(this->f->inst).
                                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
  }
  return;
}

Assistant:

void RegAllocator::calc_live_intervals() {
  int curr_bb = 0;
  for (int i = 0; i < f.inst.size(); i++) {
    auto inst_ = &*f.inst[i];
    if (auto x = dynamic_cast<PureInst *>(inst_)) {
      //   noop
    } else if (auto x = dynamic_cast<Arith4Inst *>(inst_)) {
      add_reg_read(x->r1, i);
      add_reg_read(x->r2, i);
      add_reg_read(x->r3, i);
      add_reg_write(x->rd, i);
    } else if (auto x = dynamic_cast<Arith3Inst *>(inst_)) {
      add_reg_read(x->r1, i);
      add_reg_read(x->r2, i);
      add_reg_write(x->rd, i);
    } else if (auto x = dynamic_cast<Arith2Inst *>(inst_)) {
      if (x->op == arm::OpCode::Mov || x->op == arm::OpCode::MovT ||
          x->op == arm::OpCode::Mvn) {
        add_reg_write(x->r1, i);
        if (auto r2 = std::get_if<RegisterOperand>(&x->r2);
            x->op == arm::OpCode::Mov && r2 && r2->shift_amount == 0) {
          if (!is_virtual_register(x->r1) &&
              !is_virtual_register(x->r2.get_reg()))
            reg_affine.insert({x->r1, x->r2.get_reg()});
        }
      } else {
        add_reg_read(x->r1, i);
      }
      add_reg_read(x->r2, i);
    } else if (auto x = dynamic_cast<BrInst *>(inst_)) {
      if (x->op == arm::OpCode::Bl) {
        bl_points.insert(i);
      }
    } else if (auto x = dynamic_cast<LoadStoreInst *>(inst_)) {
      if (x->op == arm::OpCode::LdR) {
        add_reg_write(x->rd, i);
      } else {
        // StR
        add_reg_read(x->rd, i);
      }
      if (auto mem = std::get_if<MemoryOperand>(&x->mem)) add_reg_read(*mem, i);
    } else if (auto x = dynamic_cast<MultLoadStoreInst *>(inst_)) {
      if (x->op == arm::OpCode::LdM) {
        for (auto rd : x->rd) add_reg_write(rd, i);
      } else {
        // StM
        for (auto rd : x->rd) add_reg_read(rd, i);
      }
      add_reg_read(x->rn, i);
    } else if (auto x = dynamic_cast<PushPopInst *>(inst_)) {
      if (x->op == arm::OpCode::Push) {
        for (auto rd : x->regs) add_reg_write(rd, i);
      } else {
        // pop
        for (auto rd : x->regs) add_reg_read(rd, i);
      }
    } else if (auto x = dynamic_cast<LabelInst *>(inst_)) {
      if (x->label.find(".bb_") == 0) {
        try {
          auto bb_id_idx = x->label.find_last_of("$");
          auto id_str = x->label.substr(bb_id_idx + 1);
          auto bb_id = std::stoi(id_str);
          point_bb_map.insert({i, bb_id});
          curr_bb = bb_id;
        } catch (std::exception &i) {
          LOG(WARNING) << typeid(i).name() << ": " << i.what() << std::endl;
        }
      }
    } else
      //   noop
      ;
  }
}